

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

void secp256k1_ecmult_strauss_wnaf
               (secp256k1_strauss_state *state,secp256k1_gej *r,size_t num,secp256k1_gej *a,
               secp256k1_scalar *na,secp256k1_scalar *ng)

{
  int iVar1;
  long in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R9;
  int n;
  secp256k1_scalar na_lam;
  secp256k1_scalar na_1;
  secp256k1_gej tmp;
  size_t no;
  size_t np;
  int bits;
  int i;
  int bits_ng_128;
  int wnaf_ng_128 [129];
  int bits_ng_1;
  int wnaf_ng_1 [129];
  secp256k1_scalar ng_128;
  secp256k1_scalar ng_1;
  secp256k1_fe Z;
  secp256k1_ge tmpa;
  secp256k1_gej *in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa10;
  int in_stack_fffffffffffffa14;
  int in_stack_fffffffffffffa18;
  int in_stack_fffffffffffffa1c;
  secp256k1_fe *in_stack_fffffffffffffa20;
  secp256k1_ge *in_stack_fffffffffffffa28;
  secp256k1_gej *in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa38;
  int in_stack_fffffffffffffa3c;
  secp256k1_scalar *in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa48;
  int in_stack_fffffffffffffa4c;
  secp256k1_scalar *in_stack_fffffffffffffa50;
  undefined1 local_5a8 [128];
  ulong local_528;
  ulong local_520;
  int local_514;
  int local_510;
  int local_50c;
  int local_508 [26];
  secp256k1_gej *in_stack_fffffffffffffb60;
  secp256k1_fe *in_stack_fffffffffffffb68;
  secp256k1_fe *in_stack_fffffffffffffb70;
  secp256k1_ge *in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb84;
  secp256k1_fe *in_stack_fffffffffffffb98;
  secp256k1_ge *in_stack_fffffffffffffba0;
  secp256k1_gej *in_stack_fffffffffffffba8;
  secp256k1_gej *in_stack_fffffffffffffbb0;
  secp256k1_fe *in_stack_fffffffffffffc08;
  secp256k1_ge *in_stack_fffffffffffffc10;
  secp256k1_gej *in_stack_fffffffffffffc18;
  secp256k1_gej *in_stack_fffffffffffffc20;
  int local_2fc;
  int local_2f8 [146];
  secp256k1_fe local_b0 [3];
  long local_30;
  long local_20;
  ulong local_18;
  long local_10;
  long local_8;
  
  local_2fc = 0;
  local_50c = 0;
  local_514 = 0;
  local_528 = 0;
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  secp256k1_fe_impl_set_int(local_b0,1);
  for (local_520 = 0; local_520 < local_18; local_520 = local_520 + 1) {
    iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x11c6a4);
    if ((iVar1 == 0) && (iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x11c6c5), iVar1 == 0))
    {
      secp256k1_scalar_split_lambda
                (in_stack_fffffffffffffa50,
                 (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                 in_stack_fffffffffffffa40);
      iVar1 = secp256k1_ecmult_wnaf
                        ((int *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c,
                         in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c);
      *(int *)(*(long *)(local_8 + 0x10) + local_528 * 0x410 + 0x408) = iVar1;
      iVar1 = secp256k1_ecmult_wnaf
                        ((int *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c,
                         in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c);
      *(int *)(*(long *)(local_8 + 0x10) + local_528 * 0x410 + 0x40c) = iVar1;
      if (local_514 < *(int *)(*(long *)(local_8 + 0x10) + local_528 * 0x410 + 0x408)) {
        local_514 = *(int *)(*(long *)(local_8 + 0x10) + local_528 * 0x410 + 0x408);
      }
      if (local_514 < *(int *)(*(long *)(local_8 + 0x10) + local_528 * 0x410 + 0x40c)) {
        local_514 = *(int *)(*(long *)(local_8 + 0x10) + local_528 * 0x410 + 0x40c);
      }
      memcpy(local_5a8,(void *)(local_20 + local_520 * 0x80),0x80);
      if (local_528 != 0) {
        secp256k1_gej_rescale(in_stack_fffffffffffffa30,&in_stack_fffffffffffffa28->x);
      }
      secp256k1_ecmult_odd_multiples_table
                (in_stack_fffffffffffffb84,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
                 in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      if (local_528 != 0) {
        secp256k1_fe_impl_mul
                  ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                   &in_stack_fffffffffffffa08->x,(secp256k1_fe *)0x11c942);
      }
      local_528 = local_528 + 1;
    }
  }
  if (local_528 != 0) {
    secp256k1_ge_table_set_globalz
              ((size_t)in_stack_fffffffffffffa40,
               (secp256k1_ge *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
               &in_stack_fffffffffffffa30->x);
  }
  for (local_520 = 0; local_520 < local_528; local_520 = local_520 + 1) {
    for (local_510 = 0; local_510 < 8; local_510 = local_510 + 1) {
      secp256k1_fe_impl_mul
                ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 &in_stack_fffffffffffffa08->x,(secp256k1_fe *)0x11ca3c);
    }
  }
  if (local_30 != 0) {
    secp256k1_scalar_split_128
              ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               (secp256k1_scalar *)in_stack_fffffffffffffa08,(secp256k1_scalar *)0x11ca96);
    local_2fc = secp256k1_ecmult_wnaf
                          ((int *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c,
                           in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c);
    local_50c = secp256k1_ecmult_wnaf
                          ((int *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c,
                           in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c);
    if (local_514 < local_2fc) {
      local_514 = local_2fc;
    }
    if (local_514 < local_50c) {
      local_514 = local_50c;
    }
  }
  secp256k1_gej_set_infinity((secp256k1_gej *)0x11cb2d);
  local_510 = local_514;
  while (local_510 = local_510 + -1, -1 < local_510) {
    secp256k1_gej_double_var
              ((secp256k1_gej *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               in_stack_fffffffffffffa08,(secp256k1_fe *)0x11cb65);
    for (local_520 = 0; local_520 < local_528; local_520 = local_520 + 1) {
      if ((local_510 < *(int *)(*(long *)(local_8 + 0x10) + local_520 * 0x410 + 0x408)) &&
         (in_stack_fffffffffffffa14 =
               *(int *)(*(long *)(local_8 + 0x10) + local_520 * 0x410 + (long)local_510 * 4),
         in_stack_fffffffffffffa14 != 0)) {
        secp256k1_ecmult_table_get_ge
                  ((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                   (secp256k1_ge *)in_stack_fffffffffffffa08,0,0x11cc19);
        secp256k1_gej_add_ge_var
                  (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                   in_stack_fffffffffffffb98);
      }
      if ((local_510 < *(int *)(*(long *)(local_8 + 0x10) + local_520 * 0x410 + 0x40c)) &&
         (in_stack_fffffffffffffa14 =
               *(int *)(*(long *)(local_8 + 0x10) + local_520 * 0x410 + 0x204 + (long)local_510 * 4)
         , in_stack_fffffffffffffa14 != 0)) {
        secp256k1_ecmult_table_get_ge_lambda
                  ((secp256k1_ge *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
                   in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18);
        secp256k1_gej_add_ge_var
                  (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                   in_stack_fffffffffffffb98);
      }
    }
    if ((local_510 < local_2fc) &&
       (in_stack_fffffffffffffa14 = local_2f8[local_510], in_stack_fffffffffffffa14 != 0)) {
      secp256k1_ecmult_table_get_ge_storage
                ((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 (secp256k1_ge_storage *)in_stack_fffffffffffffa08,0,0x11cd70);
      secp256k1_gej_add_zinv_var
                (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                 in_stack_fffffffffffffc08);
    }
    if ((local_510 < local_50c) &&
       (in_stack_fffffffffffffa14 = local_508[local_510], in_stack_fffffffffffffa14 != 0)) {
      secp256k1_ecmult_table_get_ge_storage
                ((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 (secp256k1_ge_storage *)in_stack_fffffffffffffa08,0,0x11cdda);
      secp256k1_gej_add_zinv_var
                (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                 in_stack_fffffffffffffc08);
    }
  }
  if (*(int *)(local_10 + 0x78) == 0) {
    secp256k1_fe_impl_mul
              ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               &in_stack_fffffffffffffa08->x,(secp256k1_fe *)0x11ce4a);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_strauss_wnaf(const struct secp256k1_strauss_state *state, secp256k1_gej *r, size_t num, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_ge tmpa;
    secp256k1_fe Z;
    /* Split G factors. */
    secp256k1_scalar ng_1, ng_128;
    int wnaf_ng_1[129];
    int bits_ng_1 = 0;
    int wnaf_ng_128[129];
    int bits_ng_128 = 0;
    int i;
    int bits = 0;
    size_t np;
    size_t no = 0;

    secp256k1_fe_set_int(&Z, 1);
    for (np = 0; np < num; ++np) {
        secp256k1_gej tmp;
        secp256k1_scalar na_1, na_lam;
        if (secp256k1_scalar_is_zero(&na[np]) || secp256k1_gej_is_infinity(&a[np])) {
            continue;
        }
        /* split na into na_1 and na_lam (where na = na_1 + na_lam*lambda, and na_1 and na_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&na_1, &na_lam, &na[np]);

        /* build wnaf representation for na_1 and na_lam. */
        state->ps[no].bits_na_1   = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_1,   129, &na_1,   WINDOW_A);
        state->ps[no].bits_na_lam = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_lam, 129, &na_lam, WINDOW_A);
        VERIFY_CHECK(state->ps[no].bits_na_1 <= 129);
        VERIFY_CHECK(state->ps[no].bits_na_lam <= 129);
        if (state->ps[no].bits_na_1 > bits) {
            bits = state->ps[no].bits_na_1;
        }
        if (state->ps[no].bits_na_lam > bits) {
            bits = state->ps[no].bits_na_lam;
        }

        /* Calculate odd multiples of a.
         * All multiples are brought to the same Z 'denominator', which is stored
         * in Z. Due to secp256k1' isomorphism we can do all operations pretending
         * that the Z coordinate was 1, use affine addition formulae, and correct
         * the Z coordinate of the result once at the end.
         * The exception is the precomputed G table points, which are actually
         * affine. Compared to the base used for other points, they have a Z ratio
         * of 1/Z, so we can use secp256k1_gej_add_zinv_var, which uses the same
         * isomorphism to efficiently add with a known Z inverse.
         */
        tmp = a[np];
        if (no) {
            secp256k1_gej_rescale(&tmp, &Z);
        }
        secp256k1_ecmult_odd_multiples_table(ECMULT_TABLE_SIZE(WINDOW_A), state->pre_a + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &Z, &tmp);
        if (no) secp256k1_fe_mul(state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &(a[np].z));

        ++no;
    }

    /* Bring them to the same Z denominator. */
    if (no) {
        secp256k1_ge_table_set_globalz(ECMULT_TABLE_SIZE(WINDOW_A) * no, state->pre_a, state->aux);
    }

    for (np = 0; np < no; ++np) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_fe_mul(&state->aux[np * ECMULT_TABLE_SIZE(WINDOW_A) + i], &state->pre_a[np * ECMULT_TABLE_SIZE(WINDOW_A) + i].x, &secp256k1_const_beta);
        }
    }

    if (ng) {
        /* split ng into ng_1 and ng_128 (where gn = gn_1 + gn_128*2^128, and gn_1 and gn_128 are ~128 bit) */
        secp256k1_scalar_split_128(&ng_1, &ng_128, ng);

        /* Build wnaf representation for ng_1 and ng_128 */
        bits_ng_1   = secp256k1_ecmult_wnaf(wnaf_ng_1,   129, &ng_1,   WINDOW_G);
        bits_ng_128 = secp256k1_ecmult_wnaf(wnaf_ng_128, 129, &ng_128, WINDOW_G);
        if (bits_ng_1 > bits) {
            bits = bits_ng_1;
        }
        if (bits_ng_128 > bits) {
            bits = bits_ng_128;
        }
    }

    secp256k1_gej_set_infinity(r);

    for (i = bits - 1; i >= 0; i--) {
        int n;
        secp256k1_gej_double_var(r, r, NULL);
        for (np = 0; np < no; ++np) {
            if (i < state->ps[np].bits_na_1 && (n = state->ps[np].wnaf_na_1[i])) {
                secp256k1_ecmult_table_get_ge(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
            if (i < state->ps[np].bits_na_lam && (n = state->ps[np].wnaf_na_lam[i])) {
                secp256k1_ecmult_table_get_ge_lambda(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
        }
        if (i < bits_ng_1 && (n = wnaf_ng_1[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
        if (i < bits_ng_128 && (n = wnaf_ng_128[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g_128, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
    }

    if (!r->infinity) {
        secp256k1_fe_mul(&r->z, &r->z, &Z);
    }
}